

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::SPxMainSM<double>::DuplicateRowsPS::execute
          (DuplicateRowsPS *this,VectorBase<double> *param_1,VectorBase<double> *y,
          VectorBase<double> *s,VectorBase<double> *param_4,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  VarStatus VVar6;
  pointer pdVar7;
  VarStatus *pVVar8;
  int *piVar9;
  Nonzero<double> *pNVar10;
  Nonzero<double> *pNVar11;
  bool bVar12;
  ulong uVar13;
  VarStatus *pVVar14;
  pointer pdVar15;
  ulong uVar16;
  long lVar17;
  byte bVar18;
  long lVar19;
  bool *pbVar20;
  double dVar21;
  
  pdVar15 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (this->m_isLast == true) {
    uVar1 = (this->m_perm).thesize;
    pdVar7 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar8 = rStatus->data;
    piVar9 = (this->m_perm).data;
    for (lVar17 = 0; 0 < (int)(uVar1 + (int)lVar17); lVar17 = lVar17 + -1) {
      lVar19 = (long)piVar9[(ulong)uVar1 + lVar17 + -1];
      if (-1 < lVar19) {
        pdVar15[(ulong)uVar1 + lVar17 + -1] = pdVar15[lVar19];
        pdVar7[(ulong)uVar1 + lVar17 + -1] = pdVar7[lVar19];
        pVVar8[(ulong)uVar1 + lVar17 + -1] = pVVar8[lVar19];
      }
    }
    pdVar15 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  uVar1 = (this->m_scale).super_SVectorBase<double>.memused;
  pNVar10 = (this->m_scale).super_SVectorBase<double>.m_elem;
  iVar2 = this->m_i;
  uVar16 = 0;
  uVar13 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar13 = uVar16;
  }
  for (; uVar13 * 0x10 != uVar16; uVar16 = uVar16 + 0x10) {
    iVar3 = *(int *)((long)&pNVar10->idx + uVar16);
    if (iVar3 != iVar2) {
      pdVar15[iVar3] = pdVar15[iVar2] / *(double *)((long)&pNVar10->val + uVar16);
    }
  }
  iVar2 = this->m_i;
  pVVar8 = rStatus->data;
  iVar3 = this->m_maxLhsIdx;
  pdVar15 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar4 = this->m_minRhsIdx;
  pNVar10 = (this->m_scale).super_SVectorBase<double>.m_elem;
  pNVar11 = (this->m_rowObj).super_SVectorBase<double>.m_elem;
  pbVar20 = (this->m_isLhsEqualRhs).data;
  uVar16 = 0;
  bVar18 = 0;
  do {
    if (uVar13 * 0x10 == uVar16) {
      return;
    }
    iVar5 = *(int *)((long)&pNVar10->idx + uVar16);
    VVar6 = pVVar8[iVar2];
    if ((VVar6 == BASIC) || ((bool)(bVar18 & iVar5 != iVar2))) {
LAB_001c173c:
      pdVar15[iVar5] = *(double *)((long)&pNVar11->val + uVar16);
      pVVar14 = pVVar8 + iVar5;
LAB_001c174c:
      *pVVar14 = BASIC;
    }
    else if (VVar6 == FIXED) {
      if ((iVar5 == iVar3) || (iVar5 == this->m_minRhsIdx)) {
        pdVar15[iVar5] = pdVar15[iVar2] * *(double *)((long)&pNVar10->val + uVar16);
        pdVar15[iVar2] = this->m_i_rowObj;
        if (*pbVar20 == true) {
          pVVar8[iVar5] = FIXED;
        }
        else {
          dVar21 = *(double *)((long)&pNVar10->val + uVar16) * pNVar10->val;
          if (iVar5 == iVar3) {
            bVar12 = 0.0 < dVar21;
          }
          else {
            bVar12 = dVar21 <= 0.0;
          }
          pVVar8[iVar5] = (uint)bVar12;
        }
        goto LAB_001c1856;
      }
LAB_001c176c:
      if (iVar5 != iVar2) goto LAB_001c173c;
    }
    else {
      if ((VVar6 == ON_LOWER) && (iVar5 == iVar3)) {
        pdVar15[iVar3] = pdVar15[iVar2] * *(double *)((long)&pNVar10->val + uVar16);
        pdVar15[iVar2] = this->m_i_rowObj;
        pVVar8[iVar3] = (uint)(0.0 < *(double *)((long)&pNVar10->val + uVar16) * pNVar10->val);
      }
      else {
        if ((VVar6 != ON_UPPER) || (iVar5 != iVar4)) goto LAB_001c176c;
        pdVar15[iVar4] = pdVar15[iVar2] * *(double *)((long)&pNVar10->val + uVar16);
        pdVar15[iVar2] = this->m_i_rowObj;
        pVVar8[iVar4] = (uint)(*(double *)((long)&pNVar10->val + uVar16) * pNVar10->val <= 0.0);
      }
LAB_001c1856:
      bVar18 = 1;
      pVVar14 = pVVar8 + iVar2;
      if (iVar5 != iVar2) goto LAB_001c174c;
    }
    uVar16 = uVar16 + 0x10;
    pbVar20 = pbVar20 + 1;
  } while( true );
}

Assistant:

void SPxMainSM<R>::DuplicateRowsPS::execute(VectorBase<R>&, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>&,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the duplicated rows:
   if(m_isLast)
   {
      for(int i = m_perm.size() - 1; i >= 0; --i)
      {
         if(m_perm[i] >= 0)
         {
            int rIdx_new = m_perm[i];
            int rIdx = i;
            s[rIdx] = s[rIdx_new];
            y[rIdx] = y[rIdx_new];
            rStatus[rIdx] = rStatus[rIdx_new];
         }
      }
   }

   // primal:
   for(int k = 0; k < m_scale.size(); ++k)
   {
      if(m_scale.index(k) != m_i)
         s[m_scale.index(k)] = s[m_i] / m_scale.value(k);
   }

   // dual & basis:
   bool haveSetBasis = false;

   for(int k = 0; k < m_scale.size(); ++k)
   {
      int i = m_scale.index(k);

      if(rStatus[m_i] == SPxSolverBase<R>::BASIC || (haveSetBasis && i != m_i))
         // if the row with tightest lower and upper bound in the basic, every duplicate row should in basic
         // or basis status of row m_i has been set, this row should be in basis
      {
         y[i]       = m_rowObj.value(k);
         rStatus[i] = SPxSolverBase<R>::BASIC;
         continue;
      }

      SOPLEX_ASSERT_WARN("WMAISM02", isNotZero(m_scale.value(k), this->epsilon()));

      if(rStatus[m_i] == SPxSolverBase<R>::FIXED && (i == m_maxLhsIdx || i == m_minRhsIdx))
      {
         // this row leads to the tightest lower or upper bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         if(m_isLhsEqualRhs[k])
         {
            rStatus[i] = SPxSolverBase<R>::FIXED;
         }
         else if(i == m_maxLhsIdx)
         {
            rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_LOWER :
                         SPxSolverBase<R>::ON_UPPER;
         }
         else
         {
            assert(i == m_minRhsIdx);

            rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_UPPER :
                         SPxSolverBase<R>::ON_LOWER;
         }

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i == m_maxLhsIdx && rStatus[m_i] == SPxSolverBase<R>::ON_LOWER)
      {
         // this row leads to the tightest lower bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_LOWER :
                      SPxSolverBase<R>::ON_UPPER;

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i == m_minRhsIdx && rStatus[m_i] == SPxSolverBase<R>::ON_UPPER)
      {
         // this row leads to the tightest upper bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_UPPER :
                      SPxSolverBase<R>::ON_LOWER;

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i != m_i)
      {
         // this row does not lead to the tightest lower or upper bound, slack should be in the basis
         y[i]       = m_rowObj.value(k);
         rStatus[i] = SPxSolverBase<R>::BASIC;
      }
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(m_isFirst && !this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM24 Dimension doesn't match after this step.");
   }

#endif

   // nothing to do for the reduced cost values
}